

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

bool __thiscall
capnp::InterfaceSchema::extends(InterfaceSchema *this,InterfaceSchema other,uint *counter)

{
  uint uVar1;
  Schema SVar2;
  bool bVar3;
  ulong uVar4;
  uint64_t id;
  bool bVar5;
  unsigned_long i;
  ulong uVar6;
  Schema local_c0;
  Reader superclasses;
  Fault f;
  CapTableReader *local_78;
  uint64_t *local_70;
  WirePointer *local_68;
  uint local_60;
  ushort local_5c;
  int local_58;
  PointerReader local_50;
  
  uVar1 = *counter;
  *counter = uVar1 + 1;
  superclasses.reader.segment = (SegmentReader *)CONCAT44(superclasses.reader.segment._4_4_,uVar1);
  superclasses.reader.capTable = (CapTableReader *)&MAX_SUPERCLASSES;
  superclasses.reader.ptr = " < ";
  superclasses.reader.elementCount = 4;
  superclasses.reader.step = 0;
  superclasses.reader.structDataSize._0_1_ = uVar1 < 0x40;
  if ((bool)(undefined1)superclasses.reader.structDataSize) {
    SVar2.raw = (this->super_Schema).raw;
    if ((Schema)SVar2.raw == other.super_Schema.raw) {
      bVar5 = true;
    }
    else {
      superclasses.reader.ptr = (byte *)(SVar2.raw)->generic->encodedNode;
      superclasses.reader.segment = (SegmentReader *)0x0;
      superclasses.reader.capTable = (CapTableReader *)0x0;
      superclasses.reader.elementCount = 0x7fffffff;
      superclasses.reader.step = 0;
      capnp::_::PointerReader::getStruct
                ((StructReader *)&f,(PointerReader *)&superclasses,(word *)0x0);
      local_50.pointer = (WirePointer *)0x0;
      local_50.segment = (SegmentReader *)(Exception *)0x0;
      local_50.capTable = (CapTableReader *)0x0;
      local_50.nestingLimit = 0x7fffffff;
      if (4 < local_5c) {
        local_50.pointer = local_68 + 4;
        local_50.segment = (SegmentReader *)f;
        local_50.capTable = local_78;
        local_50.nestingLimit = local_58;
      }
      bVar5 = false;
      capnp::_::PointerReader::getList(&superclasses.reader,&local_50,INLINE_COMPOSITE,(word *)0x0);
      uVar4 = superclasses.reader._24_8_ & 0xffffffff;
      if (uVar4 != 0) {
        bVar5 = false;
        uVar6 = 0;
        do {
          capnp::_::ListReader::getStructElement
                    ((StructReader *)&f,&superclasses.reader,(ElementCount)uVar6);
          if (local_60 < 0x40) {
            id = 0;
          }
          else {
            id = *local_70;
          }
          local_c0 = Schema::getDependency(&this->super_Schema,id,(ElementCount)uVar6 | 0x4000000);
          local_50.segment = (SegmentReader *)Schema::asInterface(&local_c0);
          bVar3 = extends((InterfaceSchema *)&local_50,other,counter);
          bVar5 = (bool)(bVar5 | bVar3);
          if (bVar3) {
            return bVar5;
          }
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
        bVar5 = false;
      }
    }
  }
  else {
    bVar5 = false;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int_const&>&,char_const(&)[53]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x27f,FAILED,"counter++ < MAX_SUPERCLASSES",
               "_kjCondition,\"Cyclic or absurdly-large inheritance graph detected.\"",
               (DebugComparison<unsigned_int,_const_unsigned_int_&> *)&superclasses,
               (char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    kj::_::Debug::Fault::~Fault(&f);
  }
  return bVar5;
}

Assistant:

bool InterfaceSchema::extends(InterfaceSchema other, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return false;
  }

  if (other == *this) {
    return true;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    if (getDependency(superclass.getId(), location).asInterface().extends(other, counter)) {
      return true;
    }
  }

  return false;
}